

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

size_t decodeCobs(void *buffer,void *p,size_t size)

{
  uint8_t block;
  uint8_t code;
  uint8_t *dst;
  uint8_t *src;
  size_t size_local;
  void *p_local;
  void *buffer_local;
  
  code = 0xff;
  block = '\0';
  dst = (uint8_t *)buffer;
  src = (uint8_t *)p;
  size_local = size;
  while (size_local != 0) {
    if (block == '\0') {
      block = *src;
      if ((block != '\0') && (code != 0xff)) {
        *dst = '\0';
        dst = dst + 1;
      }
      code = block;
      if (block == '\0') break;
    }
    else {
      *dst = *src;
      dst = dst + 1;
    }
    src = src + 1;
    block = block + 0xff;
    size_local = size_local - 1;
  }
  return (long)dst - (long)buffer;
}

Assistant:

size_t decodeCobs(
	void* buffer, // must be big enough
	void const* p,
	size_t size
) {
	uint8_t const* src = (uint8_t*)p; // encoded input byte pointer
	uint8_t* dst = (uint8_t*)buffer; // decoded output byte pointer
	uint8_t code = 0xff;
	uint8_t block = 0;

	for (; size--; block--) {
		if (block) // decode block byte
			*dst++ = *src++;
		else {
			block = *src++; // fetch the next block length
			if (block && code != 0xff) // encoded zero, write it unless it's delimiter.
				*dst++ = 0;
			code = block;
			if (!code) // delimiter code found
				break;
		}
	}

	return dst - (uint8_t*)buffer;
}